

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O1

int secp256r1_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  ptls_key_exchange_context_t *__ptr;
  bool bVar1;
  int iVar2;
  uint8_t *secret_00;
  uECC_Curve curve;
  
  __ptr = *_ctx;
  bVar1 = true;
  if (secret == (ptls_iovec_t *)0x0) {
    iVar2 = 0;
    secret_00 = (uint8_t *)0x0;
  }
  else if ((peerkey.len == 0x41) && (*peerkey.base == '\x04')) {
    secret_00 = (uint8_t *)malloc(0x20);
    if (secret_00 == (uint8_t *)0x0) {
      iVar2 = 0x201;
      bVar1 = false;
      secret_00 = (uint8_t *)0x0;
    }
    else {
      curve = uECC_secp256r1();
      iVar2 = uECC_shared_secret(peerkey.base + 1,(uint8_t *)(__ptr + 1),secret_00,curve);
      if (iVar2 == 0) {
        bVar1 = false;
        iVar2 = 0x33;
      }
      else {
        secret->base = secret_00;
        secret->len = 0x20;
        iVar2 = 0;
      }
    }
  }
  else {
    bVar1 = false;
    secret_00 = (uint8_t *)0x0;
    iVar2 = 0x33;
  }
  if (!bVar1) {
    free(secret_00);
  }
  if (release != 0) {
    (*ptls_clear_memory)(__ptr + 1,0x20);
    free(__ptr);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return iVar2;
}

Assistant:

static int secp256r1_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_secp256r1_key_exhchange_t *ctx = (struct st_secp256r1_key_exhchange_t *)*_ctx;
    uint8_t *secbytes = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if (peerkey.len != SECP256R1_PUBLIC_KEY_SIZE || peerkey.base[0] != TYPE_UNCOMPRESSED_PUBLIC_KEY) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((secbytes = (uint8_t *)malloc(SECP256R1_SHARED_SECRET_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (!uECC_shared_secret(peerkey.base + 1, ctx->priv, secbytes, uECC_secp256r1())) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    *secret = ptls_iovec_init(secbytes, SECP256R1_SHARED_SECRET_SIZE);
    ret = 0;

Exit:
    if (ret != 0)
        free(secbytes);
    if (release) {
        ptls_clear_memory(ctx->priv, sizeof(ctx->priv));
        free(ctx);
        *_ctx = NULL;
    }
    return ret;
}